

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uws_client.c
# Opt level: O0

void uws_client_destroy(UWS_CLIENT_HANDLE uws_client)

{
  LOGGER_LOG p_Var1;
  ulong local_20;
  size_t i;
  LOGGER_LOG l;
  UWS_CLIENT_HANDLE uws_client_local;
  
  if (uws_client == (UWS_CLIENT_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                ,"uws_client_destroy",0x222,1,"NULL uws handle");
    }
  }
  else {
    free(uws_client->stream_buffer);
    free(uws_client->fragment_buffer);
    uws_client->stream_buffer = (uchar *)0x0;
    uws_client->fragment_buffer = (uchar *)0x0;
    if ((uws_client->uws_state | UWS_STATE_CLOSING_WAITING_FOR_CLOSE) == UWS_STATE_ERROR) {
      uws_client_close_async(uws_client,(ON_WS_CLOSE_COMPLETE)0x0,(void *)0x0);
    }
    if (uws_client->protocol_count != 0) {
      for (local_20 = 0; local_20 < uws_client->protocol_count; local_20 = local_20 + 1) {
        free(uws_client->protocols[local_20].protocol);
        uws_client->protocols[local_20].protocol = (char *)0x0;
      }
      free(uws_client->protocols);
      uws_client->protocols = (WS_INSTANCE_PROTOCOL *)0x0;
    }
    if (uws_client->underlying_io != (XIO_HANDLE)0x0) {
      xio_destroy(uws_client->underlying_io);
      uws_client->underlying_io = (XIO_HANDLE)0x0;
    }
    singlylinkedlist_destroy(uws_client->pending_sends);
    free(uws_client->resource_name);
    free(uws_client->hostname);
    Map_Destroy(uws_client->request_headers);
    free(uws_client);
  }
  return;
}

Assistant:

void uws_client_destroy(UWS_CLIENT_HANDLE uws_client)
{
    /* Codes_SRS_UWS_CLIENT_01_020: [ If uws_client is NULL, uws_client_destroy shall do nothing. ]*/
    if (uws_client == NULL)
    {
        LogError("NULL uws handle");
    }
    else
    {
        free(uws_client->stream_buffer);
        free(uws_client->fragment_buffer);
        uws_client->stream_buffer = NULL;
        uws_client->fragment_buffer = NULL;

        /* Codes_SRS_UWS_CLIENT_01_021: [ uws_client_destroy shall perform a close action if the uws instance has already been open. ]*/
        switch (uws_client->uws_state)
        {
        default:
            break;

        case UWS_STATE_OPEN:
        case UWS_STATE_ERROR:
            uws_client_close_async(uws_client, NULL, NULL);
            break;
        }

        if (uws_client->protocol_count > 0)
        {
            size_t i;

            /* Codes_SRS_UWS_CLIENT_01_437: [ uws_client_destroy shall free the protocols array allocated in uws_client_create. ]*/
            for (i = 0; i < uws_client->protocol_count; i++)
            {
                free(uws_client->protocols[i].protocol);
                uws_client->protocols[i].protocol = NULL;
            }

            free(uws_client->protocols);
            uws_client->protocols = NULL;
        }

        /* Codes_SRS_UWS_CLIENT_01_019: [ uws_client_destroy shall free all resources associated with the uws instance. ]*/
        /* Codes_SRS_UWS_CLIENT_01_023: [ uws_client_destroy shall ensure the underlying IO created in uws_client_open_async is destroyed by calling xio_destroy. ]*/
        if (uws_client->underlying_io != NULL)
        {
            xio_destroy(uws_client->underlying_io);
            uws_client->underlying_io = NULL;
        }

        /* Codes_SRS_UWS_CLIENT_01_024: [ uws_client_destroy shall free the list used to track the pending sends by calling singlylinkedlist_destroy. ]*/
        singlylinkedlist_destroy(uws_client->pending_sends);
        free(uws_client->resource_name);
        free(uws_client->hostname);
        Map_Destroy(uws_client->request_headers);
        free(uws_client);
    }
}